

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAApolynomialStorePnt(IDAMem IDA_mem,IDAdtpntMem d)

{
  void *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  long in_RSI;
  N_Vector in_RDI;
  int retval;
  int is;
  IDApolynomialDataMem content;
  IDAadjMem IDAADJ_mem;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pvVar1 = in_RDI[0x58].content;
  puVar2 = *(undefined8 **)(in_RSI + 8);
  N_VScale(0x3ff0000000000000,in_RDI[0xe].ops,*puVar2);
  if (puVar2[2] != 0) {
    IDAAGettnSolutionYp((IDAMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                       );
  }
  if (*(int *)((long)pvVar1 + 0xb8) != 0) {
    for (local_2c = 0; local_2c < *(int *)&in_RDI[6].sunctx; local_2c = local_2c + 1) {
      *(undefined8 *)((long)in_RDI[0x55].content + (long)local_2c * 8) = 0x3ff0000000000000;
    }
    iVar3 = N_VScaleVectorArray(*(undefined4 *)&in_RDI[6].sunctx,in_RDI[0x55].content,
                                in_RDI[0x23].ops,puVar2[1]);
    if (iVar3 != 0) {
      return -0x1c;
    }
    if (puVar2[3] != 0) {
      IDAAGettnSolutionYpS
                ((IDAMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (N_Vector *)in_RDI);
    }
  }
  *(undefined4 *)(puVar2 + 4) = *(undefined4 *)((long)&in_RDI[0x32].ops + 4);
  return 0;
}

Assistant:

static int IDAApolynomialStorePnt(IDAMem IDA_mem, IDAdtpntMem d)
{
  IDAadjMem IDAADJ_mem;
  IDApolynomialDataMem content;
  int is, retval;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  content    = (IDApolynomialDataMem)d->content;

  N_VScale(ONE, IDA_mem->ida_phi[0], content->y);

  /* copy also the derivative for the first data point (in this case
     content->yp is non-null). */
  if (content->yd) { IDAAGettnSolutionYp(IDA_mem, content->yd); }

  if (IDAADJ_mem->ia_storeSensi)
  {
    for (is = 0; is < IDA_mem->ida_Ns; is++) { IDA_mem->ida_cvals[is] = ONE; }

    retval = N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals,
                                 IDA_mem->ida_phiS[0], content->yS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

    /* store the derivative if it is the first data point. */
    if (content->ySd) { IDAAGettnSolutionYpS(IDA_mem, content->ySd); }
  }

  content->order = IDA_mem->ida_kused;

  return (0);
}